

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

ptr_t __thiscall
aeron::util::MemoryMappedFile::createNew
          (MemoryMappedFile *this,char *filename,off_t offset,size_t size)

{
  bool bVar1;
  FileHandle fd_00;
  long *plVar2;
  MemoryMappedFile *this_00;
  IOException *pIVar3;
  char *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr_t pVar5;
  allocator local_b7;
  allocator local_b6;
  allocator local_b5;
  FileHandle fd;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  fd_00.handle = open64(filename,0x42,0x1b6);
  fd.handle = fd_00.handle;
  if (fd_00.handle < 0) {
    pIVar3 = (IOException *)__cxa_allocate_exception(0x48);
    std::__cxx11::string::string((string *)&local_70,"failed to create file: ",&local_b5);
    std::operator+(&local_50,&local_70,filename);
    std::__cxx11::string::string
              ((string *)&local_90,
               "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
               ,&local_b6);
    pcVar4 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                        );
    std::__cxx11::string::string((string *)&local_b0,pcVar4,&local_b7);
    IOException::IOException(pIVar3,&local_50,&local_90,&local_b0,0x7f);
    __cxa_throw(pIVar3,&IOException::typeinfo,SourcedException::~SourcedException);
  }
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__FuncHolder_0018a848;
  plVar2[1] = (long)&fd;
  bVar1 = fill(fd_00,size,'\0');
  if (bVar1) {
    this_00 = (MemoryMappedFile *)operator_new(0x10);
    MemoryMappedFile(this_00,fd,offset,size);
    std::__shared_ptr<aeron::util::MemoryMappedFile,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<aeron::util::MemoryMappedFile,void>
              ((__shared_ptr<aeron::util::MemoryMappedFile,(__gnu_cxx::_Lock_policy)2> *)this,
               this_00);
    (**(code **)(*plVar2 + 8))(plVar2);
    pVar5.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    pVar5.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (ptr_t)pVar5.
                  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
  }
  pIVar3 = (IOException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_70,"failed to write to file: ",&local_b5);
  std::operator+(&local_50,&local_70,filename);
  std::__cxx11::string::string
            ((string *)&local_90,
             "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
             ,&local_b6);
  pcVar4 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                      );
  std::__cxx11::string::string((string *)&local_b0,pcVar4,&local_b7);
  IOException::IOException(pIVar3,&local_50,&local_90,&local_b0,0x89);
  __cxa_throw(pIVar3,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::createNew(const char *filename, off_t offset, size_t size)
{
    FileHandle fd;
    fd.handle = open(filename, O_RDWR|O_CREAT, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to create file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    if (!fill(fd, size, 0))
    {
        throw IOException(std::string("failed to write to file: ") + filename, SOURCEINFO);
    }

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, size));
}